

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall QThread::setStackSize(QThread *this,uint stackSize)

{
  QObjectData *pQVar1;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  local_30._0_8_ = &pQVar1[1].children.d.size;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
  local_30[8] = true;
  *(uint *)&pQVar1[1].bindingStorage.d = stackSize;
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThread::setStackSize(uint stackSize)
{
    Q_D(QThread);
    Q_ASSERT_X(!isRunning(), "QThread::setStackSize",
               "cannot change stack size while the thread is running");
    QMutexLocker locker(&d->mutex);
    d->stackSize = stackSize;
}